

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int * __thiscall
JsUtil::
BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  Recycler *this_00;
  int *piVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_1369e8;
  data.filename._0_4_ = 0x447;
  data.plusSize = (ulong)bucketCount;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if (bucketCount == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    piVar1 = (int *)&DAT_00000008;
  }
  else {
    piVar1 = (int *)new__<Memory::Recycler>((ulong)bucketCount << 2,this_00,0x56ecac);
  }
  return piVar1;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }